

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifyon(bifcxdef *ctx,int argc)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  size_t sVar5;
  byte *buf;
  runsdef val;
  char nobuf [64];
  char yesbuf [64];
  char rsp [128];
  re_context rectx;
  runsdef rStack_218;
  char local_208 [64];
  char local_1c8 [64];
  byte local_188;
  byte local_187 [127];
  re_context local_108;
  
  iVar1 = os_get_str_rsc(5,local_1c8,0x40);
  if (iVar1 != 0) {
    builtin_strncpy(local_1c8,"[Yy].*",7);
  }
  iVar1 = os_get_str_rsc(6,local_208,0x40);
  if (iVar1 != 0) {
    builtin_strncpy(local_208,"[Nn].*",7);
  }
  iVar1 = tio_is_html_mode();
  if (iVar1 != 0) {
    outformat("<font face=\'TADS-Input\'>");
  }
  outflushn(0);
  outreset();
  buf = &local_188;
  iVar1 = getstring((char *)0x0,(char *)buf,0x80);
  if (iVar1 != 0) {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f9);
  }
  iVar1 = tio_is_html_mode();
  if (iVar1 != 0) {
    outformat("</font>");
  }
  if (-1 < (char)local_188) {
    ppuVar3 = __ctype_b_loc();
    buf = &local_188;
    do {
      if ((*(byte *)((long)*ppuVar3 + (ulong)local_188 * 2 + 1) & 0x20) == 0) break;
      local_188 = buf[1];
      buf = buf + 1;
    } while (-1 < (char)local_188);
  }
  re_init(&local_108,ctx->bifcxerr);
  sVar4 = strlen(local_1c8);
  sVar5 = strlen((char *)buf);
  iVar1 = re_compile_and_match(&local_108,local_1c8,sVar4,(char *)buf,sVar5);
  sVar4 = strlen(local_208);
  sVar5 = strlen((char *)buf);
  iVar2 = re_compile_and_match(&local_108,local_208,sVar4,(char *)buf,sVar5);
  sVar4 = strlen((char *)buf);
  if (iVar1 == (int)sVar4) {
    rStack_218.runsv.runsvnum = 1;
  }
  else if (iVar2 == (int)sVar4) {
    rStack_218.runsv.runsvnum = 0;
  }
  else {
    rStack_218.runsv.runsvnum = -1;
  }
  re_delete(&local_108);
  runpush(ctx->bifcxrun,1,&rStack_218);
  return;
}

Assistant:

void bifyon(bifcxdef *ctx, int argc)
{
    char     rsp[128];
    char    *p;
    runsdef  val;
    char     yesbuf[64];
    char     nobuf[64];
    re_context  rectx;
    int      match_yes;
    int      match_no;

    bifcntargs(ctx, 0, argc);            /* check for proper argument count */

    /* load the "yes" and "no" reply patterns */
    if (os_get_str_rsc(RESID_YORN_YES, yesbuf, sizeof(yesbuf)))
        strcpy(yesbuf, "[Yy].*");
    if (os_get_str_rsc(RESID_YORN_NO, nobuf, sizeof(nobuf)))
        strcpy(nobuf, "[Nn].*");
    
    /* if we're in HTML mode, switch to input font */
    if (tio_is_html_mode())
        tioputs(ctx->bifcxtio, "<font face='TADS-Input'>");

    /* ensure the prompt is displayed */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since the last keyboard input */
    tioreset(ctx->bifcxtio);

    /* read a line of text */
    if (tiogets(ctx->bifcxtio, (char *)0, rsp, (int)sizeof(rsp)))
        runsig(ctx->bifcxrun, ERR_RUNQUIT);

    /* if we're in HTML mode, close the input font tag */
    if (tio_is_html_mode())
        tioputs(ctx->bifcxtio, "</font>");

    /* scan off leading spaces */
    for (p = rsp ; t_isspace(*p) ; ++p) ;

    /* set up our regex context */
    re_init(&rectx, ctx->bifcxerr);

    /* check for a "yes" response */
    match_yes = re_compile_and_match(&rectx, yesbuf, strlen(yesbuf),
                                     p, strlen(p));

    /* check for a "no" response */
    match_no = re_compile_and_match(&rectx, nobuf, strlen(nobuf),
                                    p, strlen(p));

    /* check the result */
    if (match_yes == (int)strlen(p))
        val.runsv.runsvnum = 1;
    else if (match_no == (int)strlen(p))
        val.runsv.runsvnum = 0;
    else
        val.runsv.runsvnum = -1;

    /* delete our regex context */
    re_delete(&rectx);

    /* push the result */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}